

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12config.c
# Opt level: O2

int aom_free_frame_buffer(YV12_BUFFER_CONFIG *ybf)

{
  int iVar1;
  
  if (ybf == (YV12_BUFFER_CONFIG *)0x0) {
    iVar1 = 2;
  }
  else {
    if (ybf->buffer_alloc_sz != 0) {
      aom_free(ybf->buffer_alloc);
    }
    if (ybf->y_pyramid != (ImagePyramid *)0x0) {
      aom_free_pyramid(ybf->y_pyramid);
    }
    if (ybf->corners != (CornerList *)0x0) {
      av1_free_corner_list(ybf->corners);
    }
    aom_remove_metadata_from_frame_buffer(ybf);
    iVar1 = 0;
    memset(ybf,0,0xd0);
  }
  return iVar1;
}

Assistant:

int aom_free_frame_buffer(YV12_BUFFER_CONFIG *ybf) {
  if (ybf) {
    if (ybf->buffer_alloc_sz > 0) {
      aom_free(ybf->buffer_alloc);
    }
#if CONFIG_AV1_ENCODER && !CONFIG_REALTIME_ONLY
    if (ybf->y_pyramid) {
      aom_free_pyramid(ybf->y_pyramid);
    }
    if (ybf->corners) {
      av1_free_corner_list(ybf->corners);
    }
#endif  // CONFIG_AV1_ENCODER && !CONFIG_REALTIME_ONLY
    aom_remove_metadata_from_frame_buffer(ybf);
    /* buffer_alloc isn't accessed by most functions.  Rather y_buffer,
      u_buffer and v_buffer point to buffer_alloc and are used.  Clear out
      all of this so that a freed pointer isn't inadvertently used */
    memset(ybf, 0, sizeof(YV12_BUFFER_CONFIG));
    return 0;
  }

  return AOM_CODEC_MEM_ERROR;
}